

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,FILE *fp)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  pointer plVar1;
  layer_creator_func p_Var2;
  pointer pBVar3;
  iterator __position;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  Net *this_01;
  bool bVar6;
  int iVar7;
  Layer *pLVar8;
  ulong uVar9;
  long lVar10;
  int bottom_blob_index;
  int top_count;
  int bottom_count;
  int typeindex;
  int layer_count;
  int blob_count;
  int magic;
  ParamDict pd;
  int local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  uint local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  Net *local_5e0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_5d8;
  ParamDict local_5d0;
  
  local_5e4 = 0;
  bVar6 = readValue<int>(&local_5e4,fp);
  iVar7 = -1;
  if (bVar6) {
    if (local_5e4 == 0x7685dd) {
      local_5ec = 0;
      bVar6 = readValue<int>(&local_5ec,fp);
      iVar7 = -1;
      if (bVar6) {
        local_5e8 = 0;
        bVar6 = readValue<int>(&local_5e8,fp);
        iVar7 = -1;
        if (bVar6) {
          local_5d8 = &this->layers;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                    (local_5d8,(long)local_5ec);
          this_00 = &this->blobs;
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)local_5e8);
          ParamDict::ParamDict(&local_5d0);
          local_600 = 0;
          if (0 < local_5ec) {
            local_5e0 = this;
            do {
              bVar6 = readValue<int>((int *)&local_5f0,fp);
              if (((!bVar6) || (bVar6 = readValue<int>(&local_5f4,fp), !bVar6)) ||
                 (bVar6 = readValue<int>(&local_5f8,fp), !bVar6)) {
LAB_00122e7e:
                iVar7 = -1;
                goto LAB_00122e83;
              }
              pLVar8 = create_layer(local_5f0);
              this_01 = local_5e0;
              if (pLVar8 == (Layer *)0x0) {
                uVar9 = (ulong)local_5f0;
                if (-1 < (int)local_5f0) {
                  plVar1 = (local_5e0->custom_layer_registry).
                           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (((int)(local_5f0 & 0xfffffeff) <
                       (int)((ulong)((long)(local_5e0->custom_layer_registry).
                                           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)plVar1
                                    ) >> 4)) &&
                     (p_Var2 = plVar1[local_5f0 & 0xfffffeff].creator,
                     p_Var2 != (layer_creator_func)0x0)) {
                    pLVar8 = (*p_Var2)();
                    if (pLVar8 != (Layer *)0x0) goto LAB_00122d0e;
                    uVar9 = (ulong)local_5f0;
                  }
                }
                fprintf(_stderr,"layer %d not exists or registered\n",uVar9);
                clear(this_01);
                goto LAB_00122e7e;
              }
LAB_00122d0e:
              std::vector<int,_std::allocator<int>_>::resize(&pLVar8->bottoms,(long)local_5f4);
              if (0 < local_5f4) {
                lVar10 = 0;
                do {
                  bVar6 = readValue<int>(&local_5fc,fp);
                  if (!bVar6) goto LAB_00122e7e;
                  pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  __position._M_current =
                       pBVar3[local_5fc].consumers.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      pBVar3[local_5fc].consumers.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&pBVar3[local_5fc].consumers,
                               __position,&local_600);
                  }
                  else {
                    *__position._M_current = local_600;
                    pBVar3[local_5fc].consumers.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                  }
                  (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10] = local_5fc;
                  lVar10 = lVar10 + 1;
                } while (lVar10 < local_5f4);
              }
              std::vector<int,_std::allocator<int>_>::resize(&pLVar8->tops,(long)local_5f8);
              if (0 < local_5f8) {
                lVar10 = 0;
                do {
                  bVar6 = readValue<int>(&local_5fc,fp);
                  if (!bVar6) goto LAB_00122e7e;
                  (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                  super__Vector_impl_data._M_start[local_5fc].producer = local_600;
                  (pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10] = local_5fc;
                  lVar10 = lVar10 + 1;
                } while (lVar10 < local_5f8);
              }
              iVar7 = ParamDict::load_param_bin(&local_5d0,fp);
              if (iVar7 == 0) {
                iVar7 = (*pLVar8->_vptr_Layer[2])(pLVar8,&local_5d0);
                if (iVar7 == 0) {
                  (local_5d8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[local_600] = pLVar8;
                }
                else {
                  load_param_bin();
                }
              }
              else {
                load_param_bin();
              }
              local_600 = local_600 + 1;
            } while (local_600 < local_5ec);
          }
          iVar7 = 0;
LAB_00122e83:
          lVar10 = 0x560;
          do {
            piVar4 = *(int **)((long)&local_5d0.params[0].v.data + lVar10);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                __ptr = *(void **)((long)&local_5d0.params[0].loaded + lVar10);
                plVar5 = *(long **)((long)&local_5d0.params[0].v.packing + lVar10);
                if (plVar5 == (long *)0x0) {
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar10 + 4) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar10 + 4) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar10) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar10) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar10) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar10) = 0;
            *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar10) = 0;
            lVar10 = lVar10 + -0x48;
          } while (lVar10 != -0x40);
        }
      }
    }
    else {
      load_param_bin();
    }
  }
  return iVar7;
}

Assistant:

int Net::load_param_bin(FILE* fp)
{
    int magic = 0;
    if (!readValue(magic, fp))
        return -1;
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    if (!readValue(layer_count, fp))
        return -1;

    int blob_count = 0;
    if (!readValue(blob_count, fp))
        return -1;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        if (!readValue(typeindex, fp))
            return -1;

        int bottom_count;
        if (!readValue(bottom_count, fp))
            return -1;

        int top_count;
        if (!readValue(top_count, fp))
            return -1;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            if (!readValue(bottom_blob_index, fp))
                return -1;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            if (!readValue(top_blob_index, fp))
                return -1;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(fp);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return 0;
}